

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drill_3.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  Date today;
  Date tomorrow;
  
  Date::Date(&today,0x7ba,6,0x1a);
  tomorrow.d = today.d;
  tomorrow.y = today.y;
  tomorrow.m = today.m;
  Date::add_day(&tomorrow,10);
  poVar1 = operator<<((ostream *)&std::cout,&today);
  poVar1 = std::operator<<(poVar1,'\n');
  poVar1 = operator<<(poVar1,&tomorrow);
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main()
{

	try
	{
		Date today{ 1978, 6,26 };
		Date tomorrow = today;
		tomorrow.add_day(10);
		std::cout << today
			<< '\n' << tomorrow << std::endl;
	}
	catch (const std::exception& e)
	{
		std::cerr << e.what() << std::endl;
	}

	return 0;
}